

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCMapping.c
# Opt level: O0

void PPC_get_insn_id(cs_struct *h,cs_insn *insn,uint id)

{
  undefined8 *puVar1;
  _Bool _Var2;
  unsigned_short uVar3;
  uint uVar4;
  uint uVar5;
  uint *in_RSI;
  long in_RDI;
  cs_struct handle;
  int i;
  undefined4 in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  uint in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff34;
  insn_map *in_stack_ffffffffffffff38;
  
  uVar3 = insn_find(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,
                    (unsigned_short **)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                   );
  uVar4 = (uint)uVar3;
  if ((uVar4 != 0) && (*in_RSI = (uint)insns[(int)uVar4].mapid, *(int *)(in_RDI + 0x60) != 0)) {
    puVar1 = *(undefined8 **)(in_RSI + 0x3c);
    *puVar1 = *(undefined8 *)insns[(int)uVar4].regs_use;
    puVar1[1] = *(undefined8 *)(insns[(int)uVar4].regs_use + 4);
    puVar1[2] = *(undefined8 *)(insns[(int)uVar4].regs_use + 8);
    uVar5 = count_positive(insns[(int)uVar4].regs_use);
    *(char *)(*(long *)(in_RSI + 0x3c) + 0x20) = (char)uVar5;
    memcpy((void *)(*(long *)(in_RSI + 0x3c) + 0x22),insns[(int)uVar4].regs_mod,0x28);
    uVar5 = count_positive(insns[(int)uVar4].regs_mod);
    *(char *)(*(long *)(in_RSI + 0x3c) + 0x4a) = (char)uVar5;
    *(undefined8 *)(*(long *)(in_RSI + 0x3c) + 0x4b) = *(undefined8 *)insns[(int)uVar4].groups;
    uVar5 = count_positive8(insns[(int)uVar4].groups);
    *(char *)(*(long *)(in_RSI + 0x3c) + 0x53) = (char)uVar5;
    if (((insns[(int)uVar4].branch & 1U) != 0) || ((insns[(int)uVar4].indirect_branch & 1U) != 0)) {
      *(undefined1 *)
       (*(long *)(in_RSI + 0x3c) + 0x4b + (ulong)*(byte *)(*(long *)(in_RSI + 0x3c) + 0x53)) = 1;
      *(char *)(*(long *)(in_RSI + 0x3c) + 0x53) =
           *(char *)(*(long *)(in_RSI + 0x3c) + 0x53) + '\x01';
    }
    _Var2 = cs_reg_write((csh)in_stack_ffffffffffffff38,
                         (cs_insn *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         in_stack_ffffffffffffff2c);
    *(_Bool *)(*(long *)(in_RSI + 0x3c) + 0x60) = _Var2;
  }
  return;
}

Assistant:

void PPC_get_insn_id(cs_struct *h, cs_insn *insn, unsigned int id)
{
	int i;

	i = insn_find(insns, ARR_SIZE(insns), id, &h->insn_cache);
	if (i != 0) {
		insn->id = insns[i].mapid;

		if (h->detail) {
#ifndef CAPSTONE_DIET
			cs_struct handle;
			handle.detail = h->detail;

			memcpy(insn->detail->regs_read, insns[i].regs_use, sizeof(insns[i].regs_use));
			insn->detail->regs_read_count = (uint8_t)count_positive(insns[i].regs_use);

			memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
			insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);

			memcpy(insn->detail->groups, insns[i].groups, sizeof(insns[i].groups));
			insn->detail->groups_count = (uint8_t)count_positive8(insns[i].groups);

			if (insns[i].branch || insns[i].indirect_branch) {
				// this insn also belongs to JUMP group. add JUMP group
				insn->detail->groups[insn->detail->groups_count] = PPC_GRP_JUMP;
				insn->detail->groups_count++;
			}

			insn->detail->ppc.update_cr0 = cs_reg_write((csh)&handle, insn, PPC_REG_CR0);
#endif
		}
	}
}